

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoAssignOneClass3(Gia_IsoMan_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int nSize;
  int iBegin;
  Gia_IsoMan_t *p_local;
  
  iVar3 = Vec_IntSize(p->vClasses);
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x22e,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  pVVar1 = p->vClasses;
  iVar3 = Vec_IntSize(p->vClasses);
  iVar3 = Vec_IntEntry(pVVar1,iVar3 + -2);
  pVVar1 = p->vClasses;
  iVar4 = Vec_IntSize(p->vClasses);
  uVar5 = Vec_IntEntry(pVVar1,iVar4 + -1);
  pVVar1 = p->vClasses;
  iVar4 = Vec_IntSize(p->vClasses);
  Vec_IntShrink(pVVar1,iVar4 + -2);
  if ((int)uVar5 < 2) {
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x234,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
  }
  if (uVar5 == 2) {
    piVar2 = p->pUniques;
    uVar6 = Gia_IsoGetItem(p,iVar3);
    if (piVar2[uVar6] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x237,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar4 = p->nUniques;
    p->nUniques = iVar4 + 1;
    piVar2 = p->pUniques;
    uVar6 = Gia_IsoGetItem(p,iVar3);
    piVar2[uVar6] = iVar4;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
    piVar2 = p->pUniques;
    uVar6 = Gia_IsoGetItem(p,iVar3 + 1);
    if (piVar2[uVar6] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x23c,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar4 = p->nUniques;
    p->nUniques = iVar4 + 1;
    piVar2 = p->pUniques;
    uVar6 = Gia_IsoGetItem(p,iVar3 + 1);
    piVar2[uVar6] = iVar4;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
  }
  else {
    piVar2 = p->pUniques;
    uVar6 = Gia_IsoGetItem(p,iVar3);
    if (piVar2[uVar6] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x243,"void Gia_IsoAssignOneClass3(Gia_IsoMan_t *)");
    }
    iVar4 = p->nUniques;
    p->nUniques = iVar4 + 1;
    piVar2 = p->pUniques;
    uVar6 = Gia_IsoGetItem(p,iVar3);
    piVar2[uVar6] = iVar4;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
  }
  piVar2 = p->pLevels;
  uVar6 = Gia_IsoGetItem(p,iVar3);
  printf("Broke ties in last class of size %d at level %d.\n",(ulong)uVar5,
         (ulong)(uint)piVar2[uVar6]);
  return;
}

Assistant:

void Gia_IsoAssignOneClass3( Gia_IsoMan_t * p )
{
    int iBegin, nSize;
    // find the last class
    assert( Vec_IntSize(p->vClasses) > 0 );
    iBegin = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 2 );
    nSize  = Vec_IntEntry( p->vClasses, Vec_IntSize(p->vClasses) - 1 );
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    // assign the class
    assert( nSize > 1 );
    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    printf( "Broke ties in last class of size %d at level %d.\n", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}